

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int *piVar1;
  int i;
  int iVar2;
  int iVar3;
  bool bVar4;
  Task<int> task;
  undefined1 local_e8 [8];
  ThreadPool<int> pool;
  
  ThreadPool<int>::ThreadPool((ThreadPool<int> *)local_e8,3,10);
  iVar2 = 0;
  iVar3 = 100;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    piVar1 = (int *)operator_new(4);
    *piVar1 = iVar2 + 100;
    task.arg = piVar1;
    task.functions = taskFunc;
    ThreadPool<int>::addTask((ThreadPool<int> *)local_e8,task);
    iVar2 = iVar2 + 1;
  }
  sleep(0x1e);
  std::operator<<((ostream *)&std::cout,"-------exit---------------\n");
  ThreadPool<int>::~ThreadPool((ThreadPool<int> *)local_e8);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    // 创建线程池
    ThreadPool<int> pool(3, 10);

    for (int i = 0; i < 100; i++)
    {
        int *num = new int(i + 100);

        pool.addTask(Task<int>(taskFunc, num));

    }

    sleep(30);  // 睡眠30秒

    cout<<"-------exit---------------\n";

    return 0;
}